

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

Ssw_Cla_t * Ssw_ClassesPrepareTargets(Aig_Man_t *pAig)

{
  Ssw_Cla_t *pSVar1;
  void *pvVar2;
  Aig_Obj_t **ppAVar3;
  int iVar4;
  size_t __size;
  
  pSVar1 = Ssw_ClassesStart(pAig);
  pSVar1->nCands1 = 0;
  __size = 0;
  for (iVar4 = 1; iVar4 + -1 < pAig->nTruePos; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCos,iVar4 + -1);
    Ssw_ObjSetConst1Cand(pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
    pSVar1->nCands1 = iVar4;
    __size = __size + 8;
  }
  ppAVar3 = (Aig_Obj_t **)malloc(__size);
  pSVar1->pMemClasses = ppAVar3;
  pSVar1->pMemClassesFree = ppAVar3;
  return pSVar1;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareTargets( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // go through the nodes
    p->nCands1 = 0;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        Ssw_ObjSetConst1Cand( pAig, Aig_ObjFanin0(pObj) );
        p->nCands1++;
    }
    // allocate room for classes
    p->pMemClassesFree = p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, p->nCands1 );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}